

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot_base.hpp
# Opt level: O0

Locked_container_t * __thiscall
sig::Slot_base::lock(Locked_container_t *__return_storage_ptr__,Slot_base *this)

{
  bool bVar1;
  value_type local_50;
  reference local_40;
  weak_ptr<void> *tracked;
  const_iterator __end2;
  const_iterator __begin2;
  Tracked_container_t *__range2;
  Slot_base *this_local;
  Locked_container_t *locked_vec;
  
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::vector
            (__return_storage_ptr__);
  __end2 = std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>::begin
                     (&this->tracked_ptrs_);
  tracked = (weak_ptr<void> *)
            std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>::end
                      (&this->tracked_ptrs_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::weak_ptr<void>_*,_std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>_>
                                     *)&tracked), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::weak_ptr<void>_*,_std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>_>
               ::operator*(&__end2);
    std::weak_ptr<void>::lock((weak_ptr<void> *)&local_50);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
              (__return_storage_ptr__,&local_50);
    std::shared_ptr<void>::~shared_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<const_std::weak_ptr<void>_*,_std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

Locked_container_t lock() const {
        Locked_container_t locked_vec;
        for (auto& tracked : tracked_ptrs_) {
            locked_vec.push_back(tracked.lock());
        }
        return locked_vec;
    }